

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

errr Term_fresh(void)

{
  _Bool _Var1;
  wchar_t *pwVar2;
  int *piVar3;
  wchar_t *pwVar4;
  int *piVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  ulong uVar12;
  term *ptVar13;
  void *pvVar14;
  void *pvVar15;
  uint uVar16;
  code *pcVar17;
  ulong uVar18;
  long lVar19;
  undefined4 *puVar20;
  wchar_t wVar21;
  uint uVar22;
  long lVar23;
  wchar_t *pwVar24;
  int iVar25;
  wchar_t *pwVar26;
  int iVar27;
  int iVar28;
  wchar_t wVar29;
  wchar_t wVar30;
  undefined4 *puVar31;
  int *piVar32;
  long lVar33;
  long lVar34;
  wchar_t *pwVar35;
  wchar_t wVar36;
  long lVar37;
  term_win *ptVar38;
  term_win *ptVar39;
  int iVar40;
  long lVar41;
  bool bVar42;
  int *local_188;
  wchar_t *local_180;
  int *local_178;
  wchar_t *local_168;
  int *local_160;
  int *local_158;
  wchar_t nta;
  wchar_t na;
  term_win *local_148;
  wchar_t *local_140;
  wchar_t *local_138;
  wchar_t *local_130;
  void *local_128;
  wchar_t local_11c;
  wchar_t *local_118;
  wchar_t *local_110;
  wchar_t nc;
  wchar_t *local_100;
  term_win *local_f8;
  ulong local_f0;
  wchar_t local_e8;
  wchar_t local_e4;
  ulong local_e0;
  int *local_d8;
  ulong local_d0;
  wchar_t local_c8;
  wchar_t local_c4;
  undefined4 *local_c0;
  wchar_t *local_b8;
  int *local_b0;
  wchar_t *local_a8;
  int *local_a0;
  wchar_t *local_98;
  int *local_90;
  wchar_t *local_88;
  int *local_80;
  wchar_t *local_78;
  int *local_70;
  wchar_t *local_68;
  int *local_60;
  wchar_t *local_58;
  int *local_50;
  wchar_t *local_48;
  int *local_40;
  long local_38;
  
  ptVar13 = Term;
  if (Term->mapped_flag != true) {
    return 1;
  }
  local_e0 = (ulong)(uint)Term->wid;
  uVar22 = Term->hgt;
  iVar40 = Term->y1;
  iVar25 = Term->y2;
  ptVar38 = Term->old;
  ptVar39 = Term->scr;
  if ((((iVar25 < iVar40) && (ptVar39->cu == ptVar38->cu)) && (ptVar39->cv == ptVar38->cv)) &&
     (((ptVar39->cx == ptVar38->cx && (ptVar39->cy == ptVar38->cy)) &&
      ((ptVar39->cnx == ptVar38->cnx &&
       ((ptVar39->cny == ptVar38->cny && (Term->total_erase != true)))))))) {
    return 1;
  }
  pcVar17 = Term->curs_hook;
  if (pcVar17 == (_func_errr_wchar_t_wchar_t *)0x0) {
    pcVar17 = Term_curs_hack;
    Term->curs_hook = Term_curs_hack;
  }
  if (ptVar13->bigcurs_hook == (_func_errr_wchar_t_wchar_t *)0x0) {
    ptVar13->bigcurs_hook = pcVar17;
  }
  if (ptVar13->wipe_hook == (_func_errr_wchar_t_wchar_t_wchar_t *)0x0) {
    ptVar13->wipe_hook = Term_wipe_hack;
  }
  if (ptVar13->text_hook == (_func_errr_wchar_t_wchar_t_wchar_t_wchar_t_wchar_t_ptr *)0x0) {
    ptVar13->text_hook = Term_text_hack;
  }
  if (ptVar13->pict_hook ==
      (_func_errr_wchar_t_wchar_t_wchar_t_wchar_t_ptr_wchar_t_ptr_wchar_t_ptr_wchar_t_ptr *)0x0) {
    ptVar13->pict_hook = Term_pict_hack;
  }
  if (ptVar13->total_erase == true) {
    if (ptVar13->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0) {
      (*ptVar13->xtra_hook)(L'\x03',L'\0');
    }
    ptVar38->cu = false;
    ptVar38->cv = false;
    ptVar38->cx = 0;
    ptVar38->cy = 0;
    ptVar38->cnx = 1;
    ptVar38->cny = 1;
    uVar12 = 0;
    iVar28 = (int)local_e0;
    iVar40 = 0;
    if (0 < iVar28) {
      iVar40 = iVar28;
    }
    uVar18 = 0;
    if (0 < (int)uVar22) {
      uVar18 = (ulong)uVar22;
    }
    for (; ptVar13 = Term, uVar12 != uVar18; uVar12 = uVar12 + 1) {
      piVar32 = ptVar38->a[uVar12];
      pwVar2 = ptVar38->c[uVar12];
      piVar3 = ptVar38->ta[uVar12];
      pwVar4 = ptVar38->tc[uVar12];
      for (lVar23 = 0; iVar40 != (int)lVar23; lVar23 = lVar23 + 1) {
        piVar32[lVar23] = 1;
        pwVar2[lVar23] = L' ';
        piVar3[lVar23] = 1;
        pwVar4[lVar23] = L' ';
      }
    }
    Term->y1 = 0;
    iVar25 = uVar22 - 1;
    ptVar13->y2 = iVar25;
    for (uVar12 = 0; uVar18 != uVar12; uVar12 = uVar12 + 1) {
      ptVar13->x1[uVar12] = 0;
      ptVar13->x2[uVar12] = iVar28 + -1;
    }
    ptVar13->total_erase = false;
    iVar40 = 0;
  }
  if (ptVar13->soft_cursor == true) {
    if ((ptVar38->cu == false) && (ptVar38->cv == true)) {
      iVar28 = ptVar38->cy;
      lVar23 = (long)iVar28;
      uVar16 = ptVar38->cny + iVar28;
      if ((int)uVar22 <= (int)uVar16) {
        uVar16 = uVar22;
      }
      iVar7 = uVar16 - 1;
      if ((int)(uVar16 - 1) < iVar28) {
        iVar7 = iVar28;
      }
      iVar28 = ptVar38->cx;
      iVar27 = ptVar38->cnx + iVar28;
      if ((int)local_e0 <= iVar27) {
        iVar27 = (int)local_e0;
      }
      iVar8 = iVar27 + -1;
      if (iVar27 + -1 < iVar28) {
        iVar8 = iVar28;
      }
      piVar32 = ptVar13->x1;
      piVar3 = ptVar13->x2;
      for (; lVar23 <= iVar7; lVar23 = lVar23 + 1) {
        for (lVar33 = (long)ptVar38->cx; lVar33 <= iVar8; lVar33 = lVar33 + 1) {
          ptVar38->c[lVar23][lVar33] = ~ptVar39->c[lVar23][lVar33];
        }
        if (ptVar38->cx < piVar32[lVar23]) {
          piVar32[lVar23] = ptVar38->cx;
        }
        if (piVar3[lVar23] < iVar8) {
          piVar3[lVar23] = iVar8;
        }
      }
      if (ptVar38->cy <= iVar40) {
        iVar40 = ptVar38->cy;
      }
      if (iVar25 <= iVar7) {
        iVar25 = iVar7;
      }
    }
  }
  else if (((ptVar39->cu != false) || (ptVar39->cv == false)) &&
          (ptVar13->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0)) {
    (*ptVar13->xtra_hook)(L'\x04',L'\0');
  }
  if (iVar40 <= iVar25) {
    local_148 = ptVar38;
    if ((Term->dblh_hook == (_func_wchar_t_wchar_t_wchar_t *)0x0) ||
       ((Term->always_pict == false && (Term->higher_pict != true)))) {
      pvVar14 = (void *)0x0;
    }
    else {
      lVar23 = (long)(int)local_e0;
      pvVar14 = mem_alloc((ulong)tile_height << 3);
      for (uVar12 = 0; uVar12 < tile_height; uVar12 = uVar12 + 1) {
        pvVar15 = mem_zalloc(lVar23 << 2);
        *(void **)((long)pvVar14 + uVar12 * 8) = pvVar15;
      }
    }
    ptVar13 = Term;
    if ((Term->icky_corner == true) && ((int)(uVar22 - 1) <= iVar25)) {
      iVar28 = (int)local_e0 + -2;
      if (iVar28 < Term->x2[(long)(int)uVar22 + -1]) {
        Term->x2[(long)(int)uVar22 + -1] = iVar28;
      }
    }
    ptVar13->y1 = uVar22;
    ptVar13->y2 = 0;
    local_d0 = 0;
    uVar12 = 0;
    if (0 < (int)local_e0) {
      uVar12 = local_e0 & 0xffffffff;
    }
    local_38 = (long)iVar25;
    ptVar38 = local_148;
    local_128 = pvVar14;
    local_f8 = ptVar39;
    local_f0 = uVar12;
    for (lVar23 = (long)iVar40; ptVar13 = Term, lVar23 <= local_38; lVar23 = lVar23 + 1) {
      piVar32 = Term->x2;
      uVar22 = Term->x1[lVar23];
      lVar37 = (long)(int)uVar22;
      iVar40 = piVar32[lVar23];
      lVar34 = (long)iVar40;
      lVar33 = (long)(int)local_d0;
      if (iVar40 < (int)uVar22) {
        if (pvVar14 != (void *)0x0) {
          for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
            *(undefined4 *)(*(long *)((long)pvVar14 + lVar33 * 8) + uVar18 * 4) = 0;
          }
          local_d0 = (long)((int)local_d0 + 1) % (long)(int)(uint)tile_height & 0xffffffff;
        }
      }
      else {
        Term->x1[lVar23] = (int)local_e0;
        piVar32[lVar23] = 0;
        local_130 = (wchar_t *)(ulong)uVar22;
        wVar29 = (wchar_t)lVar23;
        if (ptVar13->always_pict == true) {
          if (ptVar13->dblh_hook == (_func_wchar_t_wchar_t_wchar_t *)0x0) {
            ptVar38 = ptVar13->old;
            ptVar39 = ptVar13->scr;
            piVar32 = ptVar39->a[lVar23];
            pwVar2 = ptVar39->c[lVar23];
            local_138 = ptVar39->ta[lVar23];
            pwVar4 = ptVar39->tc[lVar23];
            local_140 = local_138 + lVar37;
            pwVar35 = ptVar38->tc[lVar23];
            piVar3 = ptVar38->ta[lVar23];
            pwVar26 = ptVar38->c[lVar23];
            piVar6 = ptVar38->a[lVar23];
            wVar30 = L'\0';
            wVar9 = L'\0';
            local_130 = pwVar2;
            local_110 = pwVar4;
            for (lVar33 = 0; lVar37 + lVar33 <= lVar34; lVar33 = lVar33 + 1) {
              wVar21 = pwVar2[lVar37 + lVar33];
              wVar10 = local_140[lVar33];
              wVar36 = pwVar4[lVar37 + lVar33];
              if (((piVar32[lVar37 + lVar33] == piVar6[lVar37 + lVar33]) &&
                  (wVar21 == pwVar26[lVar37 + lVar33])) &&
                 ((wVar10 == piVar3[lVar37 + lVar33] && (wVar36 == pwVar35[lVar37 + lVar33])))) {
                wVar21 = L'\0';
                if (wVar9 != L'\0') {
                  (*Term->pict_hook)(wVar30,wVar29,wVar9,piVar32 + wVar30,local_130 + wVar30,
                                     local_138 + wVar30,local_110 + wVar30);
                }
              }
              else {
                piVar6[lVar37 + lVar33] = piVar32[lVar37 + lVar33];
                pwVar26[lVar37 + lVar33] = wVar21;
                piVar3[lVar37 + lVar33] = wVar10;
                pwVar35[lVar37 + lVar33] = wVar36;
                wVar21 = wVar9 + L'\x01';
                if (wVar9 == L'\0') {
                  wVar30 = uVar22 + (int)lVar33;
                }
              }
              wVar9 = wVar21;
            }
            ptVar38 = local_148;
            ptVar39 = local_f8;
            if (wVar9 != L'\0') {
              (*Term->pict_hook)(wVar30,wVar29,wVar9,piVar32 + wVar30,local_130 + wVar30,
                                 local_138 + wVar30,local_110 + wVar30);
              ptVar38 = local_148;
              ptVar39 = local_f8;
            }
          }
          else {
            ptVar38 = ptVar13->old;
            ptVar39 = ptVar13->scr;
            local_a0 = ptVar39->a[lVar23];
            local_a8 = ptVar39->c[lVar23];
            local_b0 = ptVar39->ta[lVar23];
            local_b8 = ptVar39->tc[lVar23];
            local_80 = local_b0;
            local_90 = local_a0;
            local_88 = local_a8;
            local_78 = local_b8;
            local_188 = local_a0;
            local_180 = local_a8;
            local_178 = local_b0;
            local_140 = local_b8;
            if (lVar23 < (long)((long)ptVar13->hgt - (ulong)tile_height)) {
              lVar19 = (ulong)tile_height + lVar23;
              local_90 = ptVar39->a[lVar19];
              local_88 = ptVar39->c[lVar19];
              local_80 = ptVar39->ta[lVar19];
              local_78 = ptVar39->tc[lVar19];
              local_188 = ptVar38->a[lVar19];
              local_180 = ptVar38->c[lVar19];
              local_178 = ptVar38->ta[lVar19];
              local_140 = ptVar38->tc[lVar19];
            }
            lVar33 = *(long *)((long)local_128 + lVar33 * 8);
            piVar3 = ptVar38->a[lVar23];
            pwVar2 = ptVar38->c[lVar23];
            piVar32 = ptVar38->ta[lVar23];
            pwVar4 = ptVar38->tc[lVar23];
            uVar12 = 0;
            if (0 < (int)uVar22) {
              uVar12 = (ulong)uVar22;
            }
            for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
              *(undefined4 *)(lVar33 + uVar18 * 4) = 0;
            }
            local_78 = local_78 + lVar37;
            local_80 = local_80 + lVar37;
            local_88 = local_88 + lVar37;
            local_90 = local_90 + lVar37;
            local_98 = local_140 + lVar37;
            local_40 = local_178 + lVar37;
            local_48 = local_180 + lVar37;
            local_50 = local_188 + lVar37;
            puVar31 = (undefined4 *)(lVar33 + lVar37 * 4);
            pwVar35 = local_b8 + lVar37;
            pwVar26 = local_b0 + lVar37;
            piVar32 = piVar32 + lVar37;
            local_138 = local_a8 + lVar37;
            local_110 = local_a0 + lVar37;
            wVar30 = L'\0';
            pwVar24 = (wchar_t *)0x0;
            lVar19 = lVar37;
            local_118 = pwVar26;
            local_100 = pwVar35;
            local_d8 = piVar32;
            local_c0 = puVar31;
            for (lVar41 = 0; ptVar39 = local_f8, lVar37 + lVar41 <= lVar34; lVar41 = lVar41 + 1) {
              wVar9 = piVar3[lVar37 + lVar41];
              wVar21 = local_110[lVar41];
              wVar10 = local_138[lVar41];
              wVar36 = pwVar26[lVar41];
              wVar11 = pwVar35[lVar41];
              local_140 = pwVar24;
              if (((wVar21 == wVar9) && (wVar10 == pwVar2[lVar37 + lVar41])) &&
                 ((wVar36 == piVar32[lVar41] && (wVar11 == pwVar4[lVar37 + lVar41])))) {
                puVar20 = puVar31;
                if ((local_c0[lVar41] != 0) &&
                   ((wVar9 = (*Term->dblh_hook)(wVar9,wVar10), piVar32 = local_d8,
                    pwVar35 = local_100, pwVar26 = local_118, wVar9 != L'\0' ||
                    (wVar9 = (*Term->dblh_hook)(wVar36,wVar11), piVar32 = local_d8,
                    pwVar35 = local_100, pwVar26 = local_118, wVar9 != L'\0')))) goto LAB_001f9c89;
                local_c4 = local_50[lVar41];
                local_e4 = local_40[lVar41];
                local_e8 = local_98[lVar41];
                local_c8 = local_90[lVar41];
                local_60 = (int *)CONCAT44(local_60._4_4_,local_88[lVar41]);
                local_68 = (wchar_t *)CONCAT44(local_68._4_4_,local_80[lVar41]);
                local_70 = (int *)CONCAT44(local_70._4_4_,local_78[lVar41]);
                local_58 = (wchar_t *)CONCAT44(local_58._4_4_,local_48[lVar41]);
                wVar9 = (*Term->dblh_hook)(local_c4,local_48[lVar41]);
                if ((wVar9 != L'\0') ||
                   (wVar9 = (*Term->dblh_hook)(local_e4,local_e8), wVar9 != L'\0')) {
                  piVar32 = local_d8;
                  pwVar35 = local_100;
                  pwVar26 = local_118;
                  if (local_c8 == local_c4) {
                    if ((((int)local_60 == (int)local_58) && ((wchar_t)local_68 == local_e4)) &&
                       ((wchar_t)local_70 == local_e8)) goto LAB_001f9be1;
                  }
                  goto LAB_001f9c89;
                }
LAB_001f9be1:
                local_c0[lVar41] = 0;
                uVar22 = 0;
                piVar32 = local_d8;
                pwVar35 = local_100;
                pwVar26 = local_118;
                if ((wchar_t)local_140 != L'\0') {
                  (*Term->pict_hook)(wVar30,wVar29,(wchar_t)local_140,local_a0 + wVar30,
                                     local_a8 + wVar30,local_b0 + wVar30,local_b8 + wVar30);
                  piVar32 = local_d8;
                  pwVar35 = local_100;
                  pwVar26 = local_118;
                }
              }
              else {
                puVar20 = (undefined4 *)(lVar33 + lVar19 * 4);
LAB_001f9c89:
                *puVar20 = 1;
                piVar3[lVar37 + lVar41] = wVar21;
                pwVar2[lVar37 + lVar41] = wVar10;
                piVar32[lVar41] = wVar36;
                pwVar4[lVar37 + lVar41] = wVar11;
                uVar22 = (int)local_140 + 1;
                if ((int)local_140 == 0) {
                  wVar30 = (int)local_130 + (int)lVar41;
                }
              }
              pwVar24 = (wchar_t *)(ulong)uVar22;
              lVar19 = lVar19 + 1;
              puVar31 = puVar31 + 1;
            }
            if ((wchar_t)pwVar24 != L'\0') {
              (*Term->pict_hook)(wVar30,wVar29,(wchar_t)pwVar24,local_a0 + wVar30,local_a8 + wVar30,
                                 local_b0 + wVar30,local_b8 + wVar30);
            }
            ptVar13 = Term;
            while (lVar34 = lVar34 + 1, ptVar38 = local_148, lVar34 < ptVar13->wid) {
              *(undefined4 *)(lVar33 + lVar34 * 4) = 0;
            }
LAB_001fab31:
            local_d0 = (long)((int)local_d0 + 1) % (long)(int)(uint)tile_height & 0xffffffff;
          }
        }
        else if (ptVar13->higher_pict == true) {
          if (ptVar13->dblh_hook != (_func_wchar_t_wchar_t_wchar_t *)0x0) {
            ptVar38 = ptVar13->old;
            ptVar39 = ptVar13->scr;
            piVar32 = ptVar39->a[lVar23];
            local_118 = ptVar39->c[lVar23];
            piVar3 = ptVar39->ta[lVar23];
            pwVar2 = ptVar39->tc[lVar23];
            local_88 = local_118;
            local_188 = piVar3;
            local_180 = pwVar2;
            local_178 = piVar32;
            local_168 = pwVar2;
            local_160 = piVar32;
            local_158 = piVar3;
            local_140 = local_118;
            if (lVar23 < (long)((long)ptVar13->hgt - (ulong)tile_height)) {
              lVar19 = (ulong)tile_height + lVar23;
              local_178 = ptVar39->a[lVar19];
              local_140 = ptVar39->c[lVar19];
              local_158 = ptVar39->ta[lVar19];
              local_168 = ptVar39->tc[lVar19];
              local_160 = ptVar38->a[lVar19];
              local_88 = ptVar38->c[lVar19];
              local_188 = ptVar38->ta[lVar19];
              local_180 = ptVar38->tc[lVar19];
            }
            pwVar4 = *(wchar_t **)((long)local_128 + lVar33 * 8);
            piVar6 = ptVar38->a[lVar23];
            pwVar35 = ptVar38->c[lVar23];
            piVar5 = ptVar38->ta[lVar23];
            pwVar26 = ptVar38->tc[lVar23];
            local_100 = (wchar_t *)CONCAT71(local_100._1_7_,ptVar13->always_text);
            uVar12 = 0;
            if (0 < (int)uVar22) {
              uVar12 = (ulong)uVar22;
            }
            for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
              pwVar4[uVar18] = L'\0';
            }
            local_58 = local_168 + lVar37;
            local_60 = local_158 + lVar37;
            local_68 = local_140 + lVar37;
            local_70 = local_178 + lVar37;
            local_78 = local_180 + lVar37;
            local_80 = local_188 + lVar37;
            local_88 = local_88 + lVar37;
            local_90 = local_160 + lVar37;
            local_130 = piVar3 + lVar37;
            local_138 = piVar32 + lVar37;
            local_140 = piVar6 + lVar37;
            local_110 = local_118 + lVar37;
            wVar30 = L'\x01';
            wVar9 = L'\0';
            wVar21 = L'\0';
            ptVar38 = local_148;
            local_98 = pwVar4;
            for (lVar33 = 0; lVar37 + lVar33 <= lVar34; lVar33 = lVar33 + 1) {
              wVar10 = pwVar35[lVar37 + lVar33];
              wVar36 = local_138[lVar33];
              nc = local_110[lVar33];
              nta = local_130[lVar33];
              local_11c = pwVar2[lVar37 + lVar33];
              iVar40 = (int)lVar33;
              na = wVar36;
              if ((((wVar36 == local_140[lVar33]) && (nc == wVar10)) &&
                  (nta == piVar5[lVar37 + lVar33])) && (local_11c == pwVar26[lVar37 + lVar33])) {
                if ((pwVar4[lVar37 + lVar33] != L'\0') &&
                   ((wVar10 = (*Term->dblh_hook)(local_140[lVar33],wVar10), wVar10 != L'\0' ||
                    (wVar10 = (*Term->dblh_hook)(nta,local_11c), wVar10 != L'\0')))) {
LAB_001fa529:
                  pwVar4[lVar37 + lVar33] = L'\x01';
                  wVar36 = na;
                  goto LAB_001fa430;
                }
                wVar10 = local_90[lVar33];
                wVar36 = local_88[lVar33];
                local_d8 = (int *)CONCAT44(local_d8._4_4_,local_80[lVar33]);
                local_c0 = (undefined4 *)CONCAT44(local_c0._4_4_,local_78[lVar33]);
                local_e4 = local_70[lVar33];
                local_e8 = local_68[lVar33];
                local_c4 = local_60[lVar33];
                local_c8 = local_58[lVar33];
                wVar11 = (*Term->dblh_hook)(wVar10,wVar36);
                if (wVar11 == L'\0') {
                  wVar11 = (*Term->dblh_hook)((wchar_t)local_d8,(wchar_t)local_c0);
                  if (wVar11 != L'\0') goto LAB_001fa38d;
                }
                else {
LAB_001fa38d:
                  if (((local_e4 != wVar10) || (local_e8 != wVar36)) ||
                     ((local_c4 != (wchar_t)local_d8 || (local_c8 != (wchar_t)local_c0))))
                  goto LAB_001fa529;
                }
                wVar36 = na;
                if (na == L'ÿ' || -1 < (char)na) {
                  pwVar4[lVar37 + lVar33] = L'\0';
                }
                else {
                  wVar10 = is_padding_changed(Term,wVar29,uVar22 + iVar40);
                  pwVar4[lVar37 + lVar33] = wVar10;
                  if (wVar10 != L'\0') goto LAB_001fa430;
                }
                ptVar38 = local_148;
                wVar10 = L'\0';
                if (wVar21 != L'\0') {
                  if (wVar30 == L'\0' && ((ulong)local_100 & 1) == 0) {
                    (*Term->wipe_hook)(wVar9,wVar29,wVar21);
                    wVar30 = L'\0';
                  }
                  else {
                    (*Term->text_hook)(wVar9,wVar29,wVar21,wVar30,local_118 + wVar9);
                  }
                  wVar10 = L'\0';
                }
              }
              else {
                pwVar4[lVar37 + lVar33] = L'\x01';
LAB_001fa430:
                ptVar38 = local_148;
                local_140[lVar33] = wVar36;
                pwVar35[lVar37 + lVar33] = nc;
                piVar5[lVar37 + lVar33] = nta;
                pwVar26[lVar37 + lVar33] = local_11c;
                if ((char)wVar36 < '\0') {
                  if (wVar21 != L'\0') {
                    if (wVar30 == L'\0' && ((ulong)local_100 & 1) == 0) {
                      (*Term->wipe_hook)(wVar9,wVar29,wVar21);
                      wVar36 = na;
                    }
                    else {
                      (*Term->text_hook)(wVar9,wVar29,wVar21,wVar30,local_118 + wVar9);
                      wVar36 = na;
                    }
                  }
                  ptVar38 = local_148;
                  wVar10 = L'\0';
                  if (wVar36 != L'ÿ') {
                    (*Term->pict_hook)(uVar22 + iVar40,wVar29,L'\x01',&na,&nc,&nta,&local_11c);
                    ptVar38 = local_148;
                    wVar10 = L'\0';
                  }
                }
                else if (wVar30 == wVar36) {
                  wVar10 = wVar21 + L'\x01';
                  if (wVar21 == L'\0') {
                    wVar9 = uVar22 + iVar40;
                  }
                }
                else {
                  if (wVar21 != L'\0') {
                    if (wVar30 == L'\0' && ((ulong)local_100 & 1) == 0) {
                      (*Term->wipe_hook)(wVar9,wVar29,wVar21);
                    }
                    else {
                      (*Term->text_hook)(wVar9,wVar29,wVar21,wVar30,local_118 + wVar9);
                    }
                  }
                  wVar9 = uVar22 + iVar40;
                  wVar10 = L'\x01';
                  wVar30 = na;
                }
              }
              wVar21 = wVar10;
            }
            if (wVar21 != L'\0') {
              if (wVar30 == L'\0' && ((ulong)local_100 & 1) == 0) {
                (*Term->wipe_hook)(wVar9,wVar29,wVar21);
              }
              else {
                (*Term->text_hook)(wVar9,wVar29,wVar21,wVar30,local_118 + wVar9);
              }
            }
            ptVar13 = Term;
            while (lVar34 = lVar34 + 1, ptVar39 = local_f8, lVar34 < ptVar13->wid) {
              local_98[lVar34] = L'\0';
            }
            goto LAB_001fab31;
          }
          ptVar38 = ptVar13->old;
          ptVar39 = ptVar13->scr;
          pwVar2 = ptVar39->c[lVar23];
          local_140 = ptVar39->tc[lVar23] + lVar37;
          piVar32 = ptVar39->ta[lVar23];
          pwVar4 = ptVar38->tc[lVar23];
          piVar3 = ptVar38->ta[lVar23];
          piVar6 = ptVar39->a[lVar23];
          pwVar35 = ptVar38->c[lVar23];
          pwVar26 = ptVar38->a[lVar23] + lVar37;
          local_138 = (wchar_t *)CONCAT71(local_138._1_7_,ptVar13->always_text);
          wVar21 = L'\0';
          wVar9 = L'\x01';
          wVar30 = L'\0';
          local_110 = pwVar26;
          for (lVar33 = 0; lVar37 + lVar33 <= lVar34; lVar33 = lVar33 + 1) {
            wVar10 = pwVar26[lVar33];
            nta = piVar6[lVar37 + lVar33];
            local_11c = pwVar2[lVar37 + lVar33];
            na = piVar32[lVar37 + lVar33];
            nc = local_140[lVar33];
            iVar40 = (int)lVar33;
            if ((((nta == wVar10) && (local_11c == pwVar35[lVar37 + lVar33])) &&
                (na == piVar3[lVar37 + lVar33])) && (nc == pwVar4[lVar37 + lVar33])) {
              bVar42 = true;
              if (wVar10 != L'ÿ' && (char)wVar10 < '\0') {
                wVar10 = is_padding_changed(Term,wVar29,(int)local_130 + iVar40);
                bVar42 = wVar10 == L'\0';
              }
              if (wVar30 != L'\0') {
                if (wVar9 == L'\0' && ((ulong)local_138 & 1) == 0) {
                  (*Term->wipe_hook)(wVar21,wVar29,wVar30);
                }
                else {
                  (*Term->text_hook)(wVar21,wVar29,wVar30,wVar9,pwVar2 + wVar21);
                }
              }
              wVar30 = L'\0';
              pwVar26 = local_110;
              if (!bVar42) {
                (*Term->pict_hook)((int)local_130 + iVar40,wVar29,L'\x01',&nta,&local_11c,&na,&nc);
                pwVar26 = local_110;
              }
            }
            else {
              pwVar26[lVar33] = nta;
              pwVar35[lVar37 + lVar33] = local_11c;
              piVar3[lVar37 + lVar33] = na;
              pwVar4[lVar37 + lVar33] = nc;
              if ((char)nta < '\0') {
                if (wVar30 != L'\0') {
                  if (wVar9 == L'\0' && ((ulong)local_138 & 1) == 0) {
                    (*Term->wipe_hook)(wVar21,wVar29,wVar30);
                  }
                  else {
                    (*Term->text_hook)(wVar21,wVar29,wVar30,wVar9,pwVar2 + wVar21);
                  }
                }
                wVar30 = L'\0';
                if (nta != L'ÿ') {
                  (*Term->pict_hook)((int)local_130 + iVar40,wVar29,L'\x01',&nta,&local_11c,&na,&nc)
                  ;
                }
              }
              else if (wVar9 == nta) {
                bVar42 = wVar30 == L'\0';
                wVar30 = wVar30 + L'\x01';
                if (bVar42) {
                  wVar21 = (int)local_130 + iVar40;
                }
              }
              else {
                if (wVar30 != L'\0') {
                  if (wVar9 == L'\0' && ((ulong)local_138 & 1) == 0) {
                    (*Term->wipe_hook)(wVar21,wVar29,wVar30);
                  }
                  else {
                    (*Term->text_hook)(wVar21,wVar29,wVar30,wVar9,pwVar2 + wVar21);
                  }
                }
                wVar30 = L'\x01';
                wVar21 = (int)local_130 + iVar40;
                wVar9 = nta;
              }
            }
          }
          ptVar38 = local_148;
          ptVar39 = local_f8;
          if (wVar30 != L'\0') {
            if (wVar9 == L'\0' && ((ulong)local_138 & 1) == 0) {
              (*Term->wipe_hook)(wVar21,wVar29,wVar30);
              ptVar38 = local_148;
              ptVar39 = local_f8;
            }
            else {
              (*Term->text_hook)(wVar21,wVar29,wVar30,wVar9,pwVar2 + wVar21);
              ptVar38 = local_148;
              ptVar39 = local_f8;
            }
          }
        }
        else {
          piVar32 = ptVar13->old->a[lVar23];
          pwVar2 = ptVar13->old->c[lVar23];
          piVar3 = ptVar13->scr->a[lVar23];
          pwVar4 = ptVar13->scr->c[lVar23];
          _Var1 = ptVar13->always_text;
          wVar9 = L'\0';
          wVar30 = L'\x01';
          wVar21 = L'\0';
          for (; ptVar39 = local_f8, lVar37 <= lVar34; lVar37 = lVar37 + 1) {
            wVar10 = piVar3[lVar37];
            wVar36 = pwVar4[lVar37];
            if ((wVar10 == piVar32[lVar37]) && (wVar36 == pwVar2[lVar37])) {
              wVar11 = L'\0';
              if (wVar21 != L'\0') {
                if (wVar30 == L'\0' && (_Var1 & 1U) == 0) {
                  (*Term->wipe_hook)(wVar9,wVar29,wVar21);
                  wVar30 = L'\0';
                }
                else {
                  (*Term->text_hook)(wVar9,wVar29,wVar21,wVar30,pwVar4 + wVar9);
                }
                wVar11 = L'\0';
              }
            }
            else {
              piVar32[lVar37] = wVar10;
              pwVar2[lVar37] = wVar36;
              wVar36 = (wchar_t)lVar37;
              if (wVar30 == wVar10) {
                wVar11 = wVar21 + L'\x01';
                if (wVar21 == L'\0') {
                  wVar9 = wVar36;
                }
              }
              else if (wVar21 == L'\0') {
                wVar9 = wVar36;
                wVar11 = L'\x01';
                wVar30 = wVar10;
              }
              else {
                if (wVar30 == L'\0' && (_Var1 & 1U) == 0) {
                  (*Term->wipe_hook)(wVar9,wVar29,wVar21);
                }
                else {
                  (*Term->text_hook)(wVar9,wVar29,wVar21,wVar30,pwVar4 + wVar9);
                }
                wVar9 = wVar36;
                wVar11 = L'\x01';
                wVar30 = wVar10;
              }
            }
            wVar21 = wVar11;
          }
          ptVar38 = local_148;
          if (wVar21 != L'\0') {
            if (wVar30 == L'\0' && (_Var1 & 1U) == 0) {
              (*Term->wipe_hook)(wVar9,wVar29,wVar21);
              ptVar38 = local_148;
            }
            else {
              (*Term->text_hook)(wVar9,wVar29,wVar21,wVar30,pwVar4 + wVar9);
              ptVar38 = local_148;
            }
          }
        }
        uVar12 = local_f0;
        pvVar14 = local_128;
        if ((Term->never_frosh == false) && (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0))
        {
          (*Term->xtra_hook)(L'\x05',wVar29);
        }
      }
    }
    if (pvVar14 != (void *)0x0) {
      for (uVar12 = 0; uVar12 < tile_height; uVar12 = uVar12 + 1) {
        mem_free(*(void **)((long)local_128 + uVar12 * 8));
      }
      mem_free(local_128);
    }
  }
  if (Term->soft_cursor == true) {
    if ((ptVar39->cu == false) && (ptVar39->cv == true)) {
      if (((tile_width < 2) && (tile_height < 2)) ||
         (((smlcurs != false || (Term->saved != '\0')) || (wVar29 = ptVar39->cy, wVar29 < L'\x01')))
         ) {
        if (bigcurs != true) {
          wVar30 = ptVar39->cx;
          wVar29 = ptVar39->cy;
          goto LAB_001fac6f;
        }
        wVar29 = ptVar39->cy;
      }
      (*Term->bigcurs_hook)(ptVar39->cx,wVar29);
      uVar16 = (uint)tile_width;
      ptVar39->cnx = uVar16;
      uVar22 = (uint)tile_height;
      goto LAB_001facb6;
    }
  }
  else if (ptVar39->cu == false) {
    _Var1 = ptVar39->cv;
    (*Term->curs_hook)(ptVar39->cx,ptVar39->cy);
    if ((_Var1 == true) && (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0)) {
      (*Term->xtra_hook)(L'\x04',L'\x01');
    }
  }
  else {
    wVar30 = (int)local_e0 + L'\xffffffff';
    wVar29 = ptVar39->cy;
LAB_001fac6f:
    (*Term->curs_hook)(wVar30,wVar29);
  }
  ptVar39->cnx = 1;
  uVar16 = 1;
  uVar22 = uVar16;
LAB_001facb6:
  ptVar39->cny = uVar22;
  ptVar38->cu = ptVar39->cu;
  ptVar38->cv = ptVar39->cv;
  iVar40 = ptVar39->cy;
  ptVar38->cx = ptVar39->cx;
  ptVar38->cy = iVar40;
  ptVar38->cnx = uVar16;
  ptVar38->cny = uVar22;
  if (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0) {
    (*Term->xtra_hook)(L'\x06',L'\0');
  }
  return 0;
}

Assistant:

errr Term_fresh(void)
{
	int x, y;

	int w = Term->wid;
	int h = Term->hgt;

	int y1 = Term->y1;
	int y2 = Term->y2;

	term_win *old = Term->old;
	term_win *scr = Term->scr;


	/* Do nothing unless "mapped" */
	if (!Term->mapped_flag) return (1);


	/* Trivial Refresh */
	if ((y1 > y2) &&
	    (scr->cu == old->cu) &&
	    (scr->cv == old->cv) &&
	    (scr->cx == old->cx) &&
	    (scr->cy == old->cy) &&
	    (scr->cnx == old->cnx) &&
	    (scr->cny == old->cny) &&
	    !(Term->total_erase)) {
		/* Nothing */
		return (1);
	}


	/* Paranoia -- use "fake" hooks to prevent core dumps */
	if (!Term->curs_hook) Term->curs_hook = Term_curs_hack;
	if (!Term->bigcurs_hook) Term->bigcurs_hook = Term->curs_hook;
	if (!Term->wipe_hook) Term->wipe_hook = Term_wipe_hack;
	if (!Term->text_hook) Term->text_hook = Term_text_hack;
	if (!Term->pict_hook) Term->pict_hook = Term_pict_hack;


	/* Handle "total erase" */
	if (Term->total_erase) {
		/* Physically erase the entire window */
		Term_xtra(TERM_XTRA_CLEAR, 0);

		/* Hack -- clear all "cursor" data */
		old->cv = old->cu = false;
		old->cx = old->cy = 0;
		old->cnx = old->cny = 1;

		/* Wipe each row */
		for (y = 0; y < h; y++) {
			int *aa = old->a[y];
			wchar_t *cc = old->c[y];
			int *taa = old->ta[y];
			wchar_t *tcc = old->tc[y];

			/* Wipe each column */
			for (x = 0; x < w; x++) {
				/* Wipe each grid */
				*aa++ = COLOUR_WHITE;
				*cc++ = ' ';

				*taa++ = COLOUR_WHITE;
				*tcc++ = ' ';
			}
		}

		/* Redraw every row */
		Term->y1 = y1 = 0;
		Term->y2 = y2 = h - 1;

		/* Redraw every column */
		for (y = 0; y < h; y++) {
			Term->x1[y] = 0;
			Term->x2[y] = w - 1;
		}

		/* Forget "total erase" */
		Term->total_erase = false;
	}


	/* Cursor update -- Erase old Cursor */
	if (Term->soft_cursor) {
		/* Cursor was visible */
		if (!old->cu && old->cv) {
		        /*
		         * Fake a change at the old cursor position so that
		         * position will be redrawn along with any other
			 * changes.
			 */
			int mty = MAX(old->cy,
				MIN(old->cy + old->cny - 1, h - 1));
			int mtx = MAX(old->cx,
				MIN(old->cx + old->cnx - 1, w - 1));
			int ty;

			for (ty = old->cy; ty <= mty; ++ty) {
				int tx;

				for (tx = old->cx; tx <= mtx; ++tx) {
					old->c[ty][tx] = ~scr->c[ty][tx];
				}
				if (Term->x1[ty] > old->cx) {
					Term->x1[ty] = old->cx;
				}
				if (Term->x2[ty] < mtx) {
					Term->x2[ty] = mtx;
				}
			}
			if (y1 > old->cy) {
			    y1 = old->cy;
			}
			if (y2 < mty) {
			    y2 = mty;
			}
		}
	} else {
		/* Cursor will be invisible */
		if (scr->cu || !scr->cv)
			Term_xtra(TERM_XTRA_SHAPE, 0);
	}


	/* Something to update */
	if (y1 <= y2) {
		int **pr_drw;
		int ipr;

		if (Term->dblh_hook && (Term->always_pict ||
				Term->higher_pict)) {
			/*
			 * Have to track whether each location in the previous
			 * tile_height rows was redrawn.  First dimension in
			 * pr_drw will be treated circularly so there's no
			 * need for copying or swapping pointers.
			 */
			pr_drw = mem_alloc(tile_height * sizeof(*pr_drw));
			for (y = 0; y < tile_height; ++y) {
				pr_drw[y] = mem_zalloc(w * sizeof(**pr_drw));
			}
		} else {
			pr_drw = NULL;
		}

		/* Handle "icky corner" */
		if ((Term->icky_corner) && (y2 >= h - 1) && (Term->x2[h - 1] > w - 2))
			Term->x2[h - 1] = w - 2;


		/*
		 * Make the stored y bounds for the modified region empty.
		 * Do so before drawing so that Term_mark() calls from within
		 * the drawing hooks will adjust the bounds on the modified
		 * region for the next update.
		 */
		Term->y1 = h;
		Term->y2 = 0;

		/* Scan the "modified" rows */
		ipr = 0;
		for (y = y1; y <= y2; ++y) {
			int x1 = Term->x1[y];
			int x2 = Term->x2[y];

			/* Flush each "modified" row */
			if (x1 <= x2) {
				/*
				 * As above, set the bounds for the modified
				 * region to be empty before drawing.
				 */
				Term->x1[y] = w;
				Term->x2[y] = 0;

				/* Use "Term_pict()" - always, sometimes or never */
				if (Term->always_pict) {
					/* Flush the row */
					if (Term->dblh_hook) {
						Term_fresh_row_pict_dblh(
							y, x1, x2, pr_drw[ipr]);
						ipr = (ipr + 1) % tile_height;
					} else {
						Term_fresh_row_pict(y, x1, x2);
					}
				} else if (Term->higher_pict) {
					/* Flush the row */
					if (Term->dblh_hook) {
						Term_fresh_row_both_dblh(
							y, x1, x2, pr_drw[ipr]);
						ipr = (ipr + 1) % tile_height;
					} else {
						Term_fresh_row_both(y, x1, x2);
					}
				} else {
					/* Flush the row */
					Term_fresh_row_text(y, x1, x2);
				}
				/* Hack -- Flush that row (if allowed) */
				if (!Term->never_frosh) Term_xtra(TERM_XTRA_FROSH, y);
			} else if (pr_drw) {
				/*
				 * Remember that nothing was redrawn on that
				 * row.
				 */
				for (x = 0; x < w; ++x) {
					pr_drw[ipr][x] = 0;
				}
				ipr = (ipr + 1) % tile_height;
			}
		}

		if (pr_drw) {
			for (y = 0; y < tile_height; ++y) {
				mem_free(pr_drw[y]);
			}
			mem_free(pr_drw);
		}
	}


	/* Cursor update -- Show new Cursor */
	if (Term->soft_cursor) {
		/* Draw the (large or small) cursor */
		if (!scr->cu && scr->cv) {
			if ((((tile_width > 1)||(tile_height > 1)) &&
			     (!smlcurs) && (Term->saved == 0) && (scr->cy > 0))
			    || bigcurs) {
				(void)((*Term->bigcurs_hook)(scr->cx, scr->cy));
				scr->cnx = tile_width;
				scr->cny = tile_height;
			} else {
				(void)((*Term->curs_hook)(scr->cx, scr->cy));
				scr->cnx = 1;
				scr->cny = 1;
			}
		} else {
			scr->cnx = 1;
			scr->cny = 1;
		}
	} else {
		/* The cursor is useless or invisible ignore it, otherwise display */
		if (scr->cu) {
			/* Paranoia -- Put the cursor NEAR where it belongs */
			(void)((*Term->curs_hook)(w - 1, scr->cy));
		} else if (!scr->cv) {
			/* Paranoia -- Put the cursor where it belongs */
			(void)((*Term->curs_hook)(scr->cx, scr->cy));
		} else {
			/* Put the cursor where it belongs */
			(void)((*Term->curs_hook)(scr->cx, scr->cy));

			/* Make the cursor visible */
			Term_xtra(TERM_XTRA_SHAPE, 1);
		}

		scr->cnx = 1;
		scr->cny = 1;
	}

	/* Save the "cursor state" */
	old->cu = scr->cu;
	old->cv = scr->cv;
	old->cx = scr->cx;
	old->cy = scr->cy;
	old->cnx = scr->cnx;
	old->cny = scr->cny;

	/* Actually flush the output */
	Term_xtra(TERM_XTRA_FRESH, 0);

	/* Success */
	return (0);
}